

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_color_picker(nk_flags *state,nk_command_buffer *out,nk_colorf *col,nk_color_format fmt,
                      nk_rect bounds,nk_vec2 padding,nk_input *in,nk_user_font *font)

{
  nk_rect *local_b0;
  nk_rect *local_a0;
  undefined1 local_8c [4];
  float bar_w;
  nk_rect alpha_bar;
  nk_rect hue_bar;
  nk_rect matrix;
  int ret;
  nk_user_font *font_local;
  nk_input *in_local;
  nk_color_format fmt_local;
  nk_colorf *col_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_20;
  nk_vec2 padding_local;
  nk_rect bounds_local;
  
  padding_local = bounds._0_8_;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5f9a,
                  "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_colorf *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (col == (nk_colorf *)0x0) {
    __assert_fail("col",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5f9b,
                  "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_colorf *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5f9c,
                  "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_colorf *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font != (nk_user_font *)0x0) {
    if ((((out == (nk_command_buffer *)0x0) || (col == (nk_colorf *)0x0)) ||
        (state == (nk_flags *)0x0)) || (font == (nk_user_font *)0x0)) {
      bounds_local.w = 0.0;
    }
    else {
      alpha_bar.x = font->height;
      state_local._4_4_ = padding.x;
      padding_local.x = bounds.x;
      hue_bar.w = state_local._4_4_ + padding_local.x;
      padding_local.y = bounds.y;
      bar_w = state_local._4_4_ + padding_local.y;
      padding_local.y = bar_w;
      padding_local.x = hue_bar.w;
      bounds_local.x = bounds.w;
      bounds_local.y = bounds.h;
      fStack_20 = padding.y;
      alpha_bar.y = bounds_local.y - (fStack_20 + fStack_20);
      alpha_bar.w = hue_bar.w +
                    ((bounds_local.x - (state_local._4_4_ + state_local._4_4_)) -
                    (state_local._4_4_ * 3.0 + alpha_bar.x * 2.0)) + state_local._4_4_;
      local_8c = (undefined1  [4])(alpha_bar.w + alpha_bar.x + state_local._4_4_);
      if (fmt == NK_RGBA) {
        local_a0 = (nk_rect *)local_8c;
      }
      else {
        local_a0 = (nk_rect *)0x0;
      }
      alpha_bar.h = bar_w;
      hue_bar.x = alpha_bar.x;
      hue_bar.y = alpha_bar.y;
      hue_bar.h = bar_w;
      bounds_local.w =
           (float)nk_color_picker_behavior
                            (state,(nk_rect *)&padding_local,(nk_rect *)&hue_bar.w,
                             (nk_rect *)&alpha_bar.w,local_a0,col,in);
      if (fmt == NK_RGBA) {
        local_b0 = (nk_rect *)local_8c;
      }
      else {
        local_b0 = (nk_rect *)0x0;
      }
      nk_draw_color_picker(out,(nk_rect *)&hue_bar.w,(nk_rect *)&alpha_bar.w,local_b0,*col);
    }
    return (int)bounds_local.w;
  }
  __assert_fail("font",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x5f9d,
                "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_colorf *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB int
nk_do_color_picker(nk_flags *state,
    struct nk_command_buffer *out, struct nk_colorf *col,
    enum nk_color_format fmt, struct nk_rect bounds,
    struct nk_vec2 padding, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int ret = 0;
    struct nk_rect matrix;
    struct nk_rect hue_bar;
    struct nk_rect alpha_bar;
    float bar_w;

    NK_ASSERT(out);
    NK_ASSERT(col);
    NK_ASSERT(state);
    NK_ASSERT(font);
    if (!out || !col || !state || !font)
        return ret;

    bar_w = font->height;
    bounds.x += padding.x;
    bounds.y += padding.x;
    bounds.w -= 2 * padding.x;
    bounds.h -= 2 * padding.y;

    matrix.x = bounds.x;
    matrix.y = bounds.y;
    matrix.h = bounds.h;
    matrix.w = bounds.w - (3 * padding.x + 2 * bar_w);

    hue_bar.w = bar_w;
    hue_bar.y = bounds.y;
    hue_bar.h = matrix.h;
    hue_bar.x = matrix.x + matrix.w + padding.x;

    alpha_bar.x = hue_bar.x + hue_bar.w + padding.x;
    alpha_bar.y = bounds.y;
    alpha_bar.w = bar_w;
    alpha_bar.h = matrix.h;

    ret = nk_color_picker_behavior(state, &bounds, &matrix, &hue_bar,
        (fmt == NK_RGBA) ? &alpha_bar:0, col, in);
    nk_draw_color_picker(out, &matrix, &hue_bar, (fmt == NK_RGBA) ? &alpha_bar:0, *col);
    return ret;
}